

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresstype.cpp
# Opt level: O3

bool IsValidDestination(CTxDestination *dest)

{
  bool bVar1;
  long lVar2;
  undefined8 *puVar3;
  long in_FS_OFFSET;
  ValidDestinationVisitor local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (long)(char)(dest->
                      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      ).
                      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      .
                      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      .
                      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      .
                      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      .
                      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      ._M_index;
  if (lVar2 == -1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar3 = &PTR__exception_003d8138;
    puVar3[1] = "std::visit: variant is valueless";
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(puVar3,&std::bad_variant_access::typeinfo,std::exception::~exception);
    }
  }
  else {
    bVar1 = (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__deduce_visit_result<bool>,_(anonymous_namespace)::ValidDestinationVisitor_&&,_const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&>
              ::_S_vtable._M_arr[lVar2]._M_data)(&local_9,dest);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return bVar1;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool IsValidDestination(const CTxDestination& dest) {
    return std::visit(ValidDestinationVisitor(), dest);
}